

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O3

void __thiscall Assimp::FBX::Cluster::~Cluster(Cluster *this)

{
  ~Cluster(this);
  operator_delete(this);
  return;
}

Assistant:

Cluster::~Cluster()
{

}